

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

shared_ptr<chatra::Node> *
chatra::
addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
          (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           *container,shared_ptr<chatra::Line> *line,NodeType type)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<chatra::Node> local_38;
  
  std::make_shared<chatra::Node>();
  std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
  emplace_back<std::shared_ptr<chatra::Node>>
            ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>> *)
             container,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  psVar1 = (container->
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  peVar2 = psVar1[-1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->type = type;
  std::__shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar2->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>,
             &line->super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>);
  return psVar1 + -1;
}

Assistant:

static std::shared_ptr<Node>& addNode(NodePtrContainer& container, const std::shared_ptr<Line>& line, NodeType type) {
	container.emplace_back(std::make_shared<Node>());
	auto& node = container.back();

	node->type = type;
	node->line = line;
	return node;
}